

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O1

int __thiscall ncnn::Normalize::forward(Normalize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  uint _c;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  Allocator *pAVar7;
  void *pvVar8;
  void *pvVar9;
  float *pfVar10;
  void *pvVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  float *pfVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Mat square_sum_blob;
  ulong local_78;
  int *piStack_70;
  
  iVar17 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  _c = bottom_blob->c;
  uVar18 = (ulong)_c;
  sVar3 = bottom_blob->elemsize;
  Mat::create(top_blob,iVar17,iVar2,_c,sVar3,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  uVar12 = iVar2 * iVar17;
  iVar17 = this->across_spatial;
  iVar2 = this->across_channel;
  if (iVar2 == 0 || iVar17 == 0) {
    if (iVar17 == 0 || iVar2 != 0) {
      if (iVar2 != 0 && iVar17 == 0) {
        pAVar7 = opt->workspace_allocator;
        local_78 = 0;
        piStack_70 = (int *)0x0;
        if (uVar12 != 0) {
          uVar14 = sVar3 * (long)(int)uVar12 + 3 & 0xfffffffffffffffc;
          if (pAVar7 == (Allocator *)0x0) {
            pvVar9 = malloc(uVar14 + 0x1c);
            local_78 = (long)pvVar9 + 0x17U & 0xfffffffffffffff0;
            *(void **)(local_78 - 8) = pvVar9;
          }
          else {
            local_78 = (*(code *)**(undefined8 **)pAVar7)(pAVar7,uVar14 + 4);
          }
          piStack_70 = (int *)(local_78 + uVar14);
          *(undefined4 *)(local_78 + uVar14) = 1;
        }
        iVar17 = -100;
        if ((local_78 != 0) && ((long)(int)uVar12 != 0)) {
          if (this->channel_shared == 0) {
            if (0 < (int)uVar12) {
              pfVar10 = (float *)bottom_blob->data;
              sVar3 = bottom_blob->cstep;
              sVar4 = bottom_blob->elemsize;
              uVar14 = 0;
              do {
                fVar20 = this->eps;
                uVar16 = uVar18;
                pfVar15 = pfVar10;
                if (0 < (int)_c) {
                  do {
                    fVar20 = fVar20 + *pfVar15 * *pfVar15;
                    pfVar15 = (float *)((long)pfVar15 + sVar3 * sVar4);
                    uVar16 = uVar16 - 1;
                  } while (uVar16 != 0);
                }
                auVar21 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar20));
                fVar19 = auVar21._0_4_;
                *(float *)(local_78 + uVar14 * 4) =
                     fVar19 * -0.5 * (fVar20 * fVar19 * fVar19 + -3.0);
                uVar14 = uVar14 + 1;
                pfVar10 = pfVar10 + 1;
              } while (uVar14 != uVar12);
            }
            if (0 < (int)_c) {
              pvVar9 = bottom_blob->data;
              sVar3 = bottom_blob->cstep;
              pvVar11 = top_blob->data;
              sVar4 = top_blob->cstep;
              pvVar8 = (this->scale_data).data;
              sVar5 = top_blob->elemsize;
              sVar6 = bottom_blob->elemsize;
              uVar14 = 0;
              do {
                if (0 < (int)uVar12) {
                  fVar20 = *(float *)((long)pvVar8 + uVar14 * 4);
                  uVar16 = 0;
                  do {
                    *(float *)((long)pvVar11 + uVar16 * 4) =
                         *(float *)((long)pvVar9 + uVar16 * 4) * fVar20 *
                         *(float *)(local_78 + uVar16 * 4);
                    uVar16 = uVar16 + 1;
                  } while (uVar12 != uVar16);
                }
                uVar14 = uVar14 + 1;
                pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar5);
                pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar6);
              } while (uVar14 != uVar18);
            }
          }
          else {
            if (0 < (int)uVar12) {
              fVar20 = *(this->scale_data).data;
              pfVar10 = (float *)bottom_blob->data;
              sVar3 = bottom_blob->cstep;
              sVar4 = bottom_blob->elemsize;
              uVar14 = 0;
              do {
                auVar21 = ZEXT416((uint)this->eps);
                uVar16 = uVar18;
                pfVar15 = pfVar10;
                if (0 < (int)_c) {
                  do {
                    auVar21._0_4_ = auVar21._0_4_ + *pfVar15 * *pfVar15;
                    pfVar15 = (float *)((long)pfVar15 + sVar3 * sVar4);
                    uVar16 = uVar16 - 1;
                  } while (uVar16 != 0);
                }
                auVar22 = rsqrtss(ZEXT816(0),auVar21);
                fVar19 = auVar22._0_4_;
                *(float *)(local_78 + uVar14 * 4) =
                     fVar19 * -0.5 * fVar20 * (auVar21._0_4_ * fVar19 * fVar19 + -3.0);
                uVar14 = uVar14 + 1;
                pfVar10 = pfVar10 + 1;
              } while (uVar14 != uVar12);
            }
            if (0 < (int)_c) {
              pvVar9 = bottom_blob->data;
              sVar3 = bottom_blob->cstep;
              pvVar11 = top_blob->data;
              sVar4 = top_blob->cstep;
              sVar5 = top_blob->elemsize;
              sVar6 = bottom_blob->elemsize;
              uVar14 = 0;
              do {
                if (0 < (int)uVar12) {
                  uVar16 = 0;
                  do {
                    *(float *)((long)pvVar11 + uVar16 * 4) =
                         *(float *)(local_78 + uVar16 * 4) * *(float *)((long)pvVar9 + uVar16 * 4);
                    uVar16 = uVar16 + 1;
                  } while (uVar12 != uVar16);
                }
                uVar14 = uVar14 + 1;
                pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar5);
                pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar6);
              } while (uVar14 != uVar18);
            }
          }
          iVar17 = 0;
        }
        if (piStack_70 == (int *)0x0) {
          return iVar17;
        }
        LOCK();
        *piStack_70 = *piStack_70 + -1;
        UNLOCK();
        if (*piStack_70 != 0) {
          return iVar17;
        }
        if (pAVar7 != (Allocator *)0x0) {
          (**(code **)(*(long *)pAVar7 + 8))();
          return iVar17;
        }
        goto LAB_00129d36;
      }
    }
    else if (0 < (int)_c) {
      pvVar9 = bottom_blob->data;
      sVar3 = bottom_blob->cstep;
      pvVar11 = top_blob->data;
      sVar4 = top_blob->cstep;
      iVar17 = this->channel_shared;
      sVar5 = bottom_blob->elemsize;
      sVar6 = top_blob->elemsize;
      uVar14 = 0;
      do {
        fVar20 = this->eps;
        if (0 < (int)uVar12) {
          uVar16 = 0;
          do {
            fVar19 = *(float *)((long)pvVar9 + uVar16 * 4);
            fVar20 = fVar20 + fVar19 * fVar19;
            uVar16 = uVar16 + 1;
          } while (uVar12 != uVar16);
        }
        if (0 < (int)uVar12) {
          auVar21 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar20));
          fVar19 = auVar21._0_4_;
          uVar16 = 0;
          if (iVar17 == 0) {
            uVar16 = uVar14;
          }
          fVar1 = *(float *)((long)(this->scale_data).data + uVar16 * 4);
          uVar16 = 0;
          do {
            *(float *)((long)pvVar11 + uVar16 * 4) =
                 *(float *)((long)pvVar9 + uVar16 * 4) * fVar1 *
                 fVar19 * -0.5 * (fVar20 * fVar19 * fVar19 + -3.0);
            uVar16 = uVar16 + 1;
          } while (uVar12 != uVar16);
        }
        uVar14 = uVar14 + 1;
        pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar5);
        pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar6);
      } while (uVar14 != uVar18);
    }
    iVar17 = 0;
  }
  else {
    pAVar7 = opt->workspace_allocator;
    local_78 = 0;
    piStack_70 = (int *)0x0;
    if (_c != 0) {
      uVar14 = sVar3 * (long)(int)_c + 3 & 0xfffffffffffffffc;
      if (pAVar7 == (Allocator *)0x0) {
        pvVar9 = malloc(uVar14 + 0x1c);
        local_78 = (long)pvVar9 + 0x17U & 0xfffffffffffffff0;
        *(void **)(local_78 - 8) = pvVar9;
      }
      else {
        local_78 = (*(code *)**(undefined8 **)pAVar7)(pAVar7,uVar14 + 4);
      }
      piStack_70 = (int *)(local_78 + uVar14);
      *(undefined4 *)(local_78 + uVar14) = 1;
    }
    iVar17 = -100;
    if ((local_78 != 0) && ((long)(int)_c != 0)) {
      uVar14 = (ulong)uVar12;
      if (0 < (int)_c) {
        pvVar9 = bottom_blob->data;
        sVar3 = bottom_blob->cstep;
        sVar4 = bottom_blob->elemsize;
        uVar16 = 0;
        do {
          fVar20 = 0.0;
          if (0 < (int)uVar12) {
            uVar13 = 0;
            do {
              fVar19 = *(float *)((long)pvVar9 + uVar13 * 4);
              fVar20 = fVar20 + fVar19 * fVar19;
              uVar13 = uVar13 + 1;
            } while (uVar14 != uVar13);
          }
          *(float *)(local_78 + uVar16 * 4) = fVar20;
          uVar16 = uVar16 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar4);
        } while (uVar16 != uVar18);
      }
      fVar20 = this->eps;
      if (0 < (int)_c) {
        uVar16 = 0;
        do {
          fVar20 = fVar20 + *(float *)(local_78 + uVar16 * 4);
          uVar16 = uVar16 + 1;
        } while (uVar18 != uVar16);
      }
      auVar21 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar20));
      fVar19 = auVar21._0_4_;
      fVar20 = fVar19 * -0.5 * (fVar20 * fVar19 * fVar19 + -3.0);
      if (this->channel_shared == 0) {
        if (0 < (int)_c) {
          pvVar9 = bottom_blob->data;
          sVar3 = bottom_blob->cstep;
          pvVar11 = top_blob->data;
          sVar4 = top_blob->cstep;
          sVar5 = top_blob->elemsize;
          pvVar8 = (this->scale_data).data;
          sVar6 = bottom_blob->elemsize;
          uVar16 = 0;
          do {
            if (0 < (int)uVar12) {
              fVar19 = *(float *)((long)pvVar8 + uVar16 * 4);
              uVar13 = 0;
              do {
                *(float *)((long)pvVar11 + uVar13 * 4) =
                     *(float *)((long)pvVar9 + uVar13 * 4) * fVar19 * fVar20;
                uVar13 = uVar13 + 1;
              } while (uVar14 != uVar13);
            }
            uVar16 = uVar16 + 1;
            pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar5);
            pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar6);
          } while (uVar16 != uVar18);
        }
      }
      else if (0 < (int)_c) {
        fVar19 = *(this->scale_data).data;
        pvVar9 = bottom_blob->data;
        sVar3 = bottom_blob->cstep;
        sVar4 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        pvVar11 = top_blob->data;
        sVar6 = bottom_blob->elemsize;
        uVar16 = 0;
        do {
          if (0 < (int)uVar12) {
            uVar13 = 0;
            do {
              *(float *)((long)pvVar11 + uVar13 * 4) =
                   *(float *)((long)pvVar9 + uVar13 * 4) * fVar20 * fVar19;
              uVar13 = uVar13 + 1;
            } while (uVar14 != uVar13);
          }
          uVar16 = uVar16 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar5);
          pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar6);
        } while (uVar16 != uVar18);
      }
      iVar17 = 0;
    }
    if (piStack_70 == (int *)0x0) {
      return iVar17;
    }
    LOCK();
    *piStack_70 = *piStack_70 + -1;
    UNLOCK();
    if (*piStack_70 != 0) {
      return iVar17;
    }
    if (pAVar7 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar7 + 8))();
      return iVar17;
    }
LAB_00129d36:
    if (local_78 != 0) {
      free(*(void **)(local_78 - 8));
    }
  }
  return iVar17;
}

Assistant:

int Normalize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (across_spatial && across_channel)
    {
        // square
        Mat square_sum_blob;
        square_sum_blob.create(channels, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);

            float ssum = 0.f;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            square_sum_blob[q] = ssum;
        }

        // sum + eps
        float ssum = eps;
        for (int q=0; q<channels; q++)
        {
            ssum += square_sum_blob[q];
        }

        // 1 / sqrt(ssum)
        float a = 1.f / sqrt(ssum);

        if (channel_shared)
        {
            float scale = a * scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                float scale = a * scale_data[q];

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * scale;
                }
            }
        }

        return 0;
    }

    if (across_spatial && !across_channel)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            float ssum = eps;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            float a = 1.f / sqrt(ssum);
            float scale = a * (channel_shared ? scale_data[0] : scale_data[q]);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] * scale;
            }
        }

        return 0;
    }

    if (!across_spatial && across_channel)
    {
        // square sum, 1 / sqrt(ssum)
        Mat square_sum_blob;
        square_sum_blob.create(size, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        if (channel_shared)
        {
            float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = eps;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                square_sum_blob[i] = 1.f / sqrt(ssum) * scale;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * square_sum_blob[i];
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = eps;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                square_sum_blob[i] = 1.f / sqrt(ssum);
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                float scale = scale_data[q];

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * square_sum_blob[i] * scale;
                }
            }
        }

        return 0;
    }

    return 0;
}